

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projections.c
# Opt level: O2

void icetGetViewportProject
               (IceTInt x,IceTInt y,IceTSizeType width,IceTSizeType height,IceTDouble *mat_out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  IceTInt global_viewport [4];
  
  icetGetIntegerv(0x12,global_viewport);
  *(undefined1 (*) [16])(mat_out + 3) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(mat_out + 1) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(mat_out + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(mat_out + 8) = (undefined1  [16])0x0;
  mat_out[10] = 1.0;
  mat_out[0xb] = 0.0;
  *mat_out = (IceTDouble)((double)(int)global_viewport._8_8_ / (double)width);
  mat_out[5] = (IceTDouble)((double)SUB84(global_viewport._8_8_,4) / (double)height);
  auVar1._0_8_ = (double)(((int)global_viewport._8_8_ - width) +
                         ((int)global_viewport._0_8_ - x) * 2);
  auVar1._8_8_ = (double)((SUB84(global_viewport._8_8_,4) - height) +
                         (SUB84(global_viewport._0_8_,4) - y) * 2);
  auVar2._8_8_ = (double)height;
  auVar2._0_8_ = (double)width;
  auVar2 = divpd(auVar1,auVar2);
  *(undefined1 (*) [16])(mat_out + 0xc) = auVar2;
  mat_out[0xe] = 0.0;
  mat_out[0xf] = 1.0;
  return;
}

Assistant:

void icetGetViewportProject(IceTInt x, IceTInt y, IceTSizeType width,
                            IceTSizeType height, IceTDouble *mat_out)
{
    IceTInt global_viewport[4];
/*     IceTDouble viewport_transform[16]; */
/*     IceTDouble tile_transform[16]; */

    icetGetIntegerv(ICET_GLOBAL_VIEWPORT, global_viewport);

/*     viewport_transform[ 0] = 0.5*global_viewport[2]; */
/*     viewport_transform[ 1] = 0.0; */
/*     viewport_transform[ 2] = 0.0; */
/*     viewport_transform[ 3] = 0.0; */

/*     viewport_transform[ 4] = 0.0; */
/*     viewport_transform[ 5] = 0.5*global_viewport[3]; */
/*     viewport_transform[ 6] = 0.0; */
/*     viewport_transform[ 7] = 0.0; */

/*     viewport_transform[ 8] = 0.0; */
/*     viewport_transform[ 9] = 0.0; */
/*     viewport_transform[10] = 1.0; */
/*     viewport_transform[11] = 0.0; */

/*     viewport_transform[12] = 0.5*global_viewport[2] + global_viewport[0]*; */
/*     viewport_transform[13] = 0.5*global_viewport[3] + global_viewport[1]*; */
/*     viewport_transform[14] = 0.0; */
/*     viewport_transform[15] = 1.0; */

/*     tile_transform[ 0] = 2.0/width; */
/*     tile_transform[ 1] = 0.0; */
/*     tile_transform[ 2] = 0.0; */
/*     tile_transform[ 3] = 0.0; */

/*     tile_transform[ 4] = 0.0; */
/*     tile_transform[ 5] = 2.0/height; */
/*     tile_transform[ 6] = 0.0; */
/*     tile_transform[ 7] = 0.0; */

/*     tile_transform[ 8] = 0.0; */
/*     tile_transform[ 9] = 0.0; */
/*     tile_transform[10] = 1.0; */
/*     tile_transform[11] = 0.0; */

/*     tile_transform[12] = -(2.0*x)/width - 1.0; */
/*     tile_transform[13] = -(2.0*y)/height - 1.0; */
/*     tile_transform[14] = 0.0; */
/*     tile_transform[15] = 1.0; */

/*     multMatrix(mat_out, tile_transform, viewport_transform); */

    mat_out[ 0] = (IceTDouble)global_viewport[2]/width;
    mat_out[ 1] = 0.0;
    mat_out[ 2] = 0.0;
    mat_out[ 3] = 0.0;

    mat_out[ 4] = 0.0;
    mat_out[ 5] = (IceTDouble)global_viewport[3]/height;
    mat_out[ 6] = 0.0;
    mat_out[ 7] = 0.0;

    mat_out[ 8] = 0.0;
    mat_out[ 9] = 0.0;
    mat_out[10] = 1.0;
    mat_out[11] = 0.0;

    mat_out[12] = (IceTDouble)(  global_viewport[2] + 2*global_viewport[0]
                             - 2*x - width)/width;
    mat_out[13] = (IceTDouble)(  global_viewport[3] + 2*global_viewport[1]
                             - 2*y - height)/height;
    mat_out[14] = 0.0;
    mat_out[15] = 1.0;
}